

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tstring.c
# Opt level: O0

int re_sbuff(CharBuff *buff,uint new_size)

{
  char *__ptr;
  uint size;
  char *buff_00;
  char *new_buff;
  char *old_buff;
  uint new_size_local;
  CharBuff *buff_local;
  
  old_buff._4_4_ = new_size;
  if (new_size <= buff->buff_size) {
    old_buff._4_4_ = buff->buff_size << 1;
  }
  size = old_buff._4_4_ + 1;
  buff->buff_size = size;
  __ptr = buff->body;
  buff_00 = (char *)malloc((ulong)size);
  buff_zero(buff_00,size);
  if (buff_00 != (char *)0x0) {
    memcpy(buff_00,buff->body,(ulong)buff->len);
    buff->body = buff_00;
    free(__ptr);
  }
  buff_local._4_4_ = (uint)(buff_00 != (char *)0x0);
  return buff_local._4_4_;
}

Assistant:

int re_sbuff(CharBuff* buff, unsigned int new_size){
    if (new_size <= buff->buff_size){
        new_size = buff->buff_size * 2;
    }
    new_size = MALLOC_SIZE(char, +new_size);
    buff->buff_size = new_size;
    char* old_buff = buff->body;
    char* new_buff = malloc(new_size);
    buff_zero(new_buff, new_size);
    if (new_buff == NULL)return false;
    buff->body = memcpy(new_buff, buff->body, buff->len);
    free(old_buff);
    return true;
}